

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O3

void pzshape::TPZShapeQuad::TransformDerivative2dQ(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (0 < num) {
    lVar7 = (long)transid * 0x20;
    lVar2 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar6 = 0;
    do {
      lVar3 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar3 <= (long)uVar6 || lVar2 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = in->fElem;
      lVar5 = lVar2 * uVar6;
      dVar1 = pdVar4[lVar5];
      if (lVar3 <= (long)uVar6 || lVar2 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar2 < 1) || (lVar3 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar5] =
           *(double *)(gTrans2dQ + lVar7) * dVar1 +
           *(double *)(gTrans2dQ + lVar7 + 0x10) * pdVar4[lVar5 + 1];
      if ((lVar2 < 2) || ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar5 + 1] =
           dVar1 * *(double *)(gTrans2dQ + lVar7 + 8) +
           pdVar4[lVar5 + 1] * *(double *)(gTrans2dQ + lVar7 + 0x18);
      uVar6 = uVar6 + 1;
    } while ((uint)num != uVar6);
  }
  return;
}

Assistant:

void TPZShapeQuad::TransformDerivative2dQ(int transid, int num, TPZFMatrix<REAL> &in) {
		
		for(int i=0;i<num;i++) {
			REAL aux[2];
			aux[0] = in(0,i);
			aux[1] = in(1,i);
			in(0,i) = gTrans2dQ[transid][0][0]*aux[0]+gTrans2dQ[transid][1][0]*aux[1];
			in(1,i) = gTrans2dQ[transid][0][1]*aux[0]+gTrans2dQ[transid][1][1]*aux[1];
		}
	}